

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanKey(Scanner *this)

{
  uint Level;
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  Level = this->FlowLevel;
  if (Level == 0) {
    rollIndent(this,this->Column,TK_BlockMappingStart,(iterator)&(this->TokenQueue).List);
    Level = this->FlowLevel;
  }
  removeSimpleKeyCandidatesOnFlowLevel(this,Level);
  this->IsSimpleKeyAllowed = this->FlowLevel == 0;
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_50._0_4_ = TK_Key;
  local_50._8_8_ = this->Current;
  local_50._16_8_ = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_50);
  std::__cxx11::string::~string((string *)&local_38);
  return true;
}

Assistant:

bool Scanner::scanKey() {
  if (!FlowLevel)
    rollIndent(Column, Token::TK_BlockMappingStart, TokenQueue.end());

  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = !FlowLevel;

  Token T;
  T.Kind = Token::TK_Key;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}